

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DearchiverBase.cpp
# Opt level: O0

void Diligent::AssignShader(IShader **pDstShader,IShader *pSrcShader,SHADER_TYPE ExpectedType)

{
  int iVar1;
  Char *pCVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  char (*in_RCX) [49];
  char (*in_R8) [49];
  Char *local_98;
  undefined1 local_90 [8];
  string msg_2;
  string msg_1;
  undefined1 local_40 [8];
  string msg;
  SHADER_TYPE ExpectedType_local;
  IShader *pSrcShader_local;
  IShader **pDstShader_local;
  
  msg.field_2._12_4_ = ExpectedType;
  if (pSrcShader == (IShader *)0x0) {
    FormatString<char[26],char[22]>
              ((string *)local_40,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"pSrcShader != nullptr",(char (*) [22])in_RCX);
    pCVar2 = (Char *)std::__cxx11::string::c_str();
    in_RCX = (char (*) [49])0x132;
    DebugAssertionFailed
              (pCVar2,"AssignShader",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DearchiverBase.cpp"
               ,0x132);
    std::__cxx11::string::~string((string *)local_40);
  }
  iVar1 = (*(pSrcShader->super_IDeviceObject).super_IObject._vptr_IObject[4])();
  if (*(int *)(CONCAT44(extraout_var,iVar1) + 8) != msg.field_2._12_4_) {
    FormatString<char[26],char[49]>
              ((string *)((long)&msg_2.field_2 + 8),(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"pSrcShader->GetDesc().ShaderType == ExpectedType",in_RCX);
    pCVar2 = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (pCVar2,"AssignShader",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DearchiverBase.cpp"
               ,0x133);
    std::__cxx11::string::~string((string *)(msg_2.field_2._M_local_buf + 8));
  }
  if (*pDstShader != (IShader *)0x0) {
    iVar1 = (*((*pDstShader)->super_IDeviceObject).super_IObject._vptr_IObject[4])();
    local_98 = GetShaderTypeLiteralName(*(SHADER_TYPE *)(CONCAT44(extraout_var_00,iVar1) + 8));
    FormatString<char[10],char_const*,char[49]>
              ((string *)local_90,(Diligent *)"Non-null ",(char (*) [10])&local_98,
               (char **)" has already been assigned. This might be a bug.",in_R8);
    pCVar2 = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (pCVar2,"AssignShader",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DearchiverBase.cpp"
               ,0x135);
    std::__cxx11::string::~string((string *)local_90);
  }
  *pDstShader = pSrcShader;
  return;
}

Assistant:

inline void AssignShader(IShader*& pDstShader, IShader* pSrcShader, SHADER_TYPE ExpectedType)
{
    VERIFY_EXPR(pSrcShader != nullptr);
    VERIFY_EXPR(pSrcShader->GetDesc().ShaderType == ExpectedType);

    VERIFY(pDstShader == nullptr, "Non-null ", GetShaderTypeLiteralName(pDstShader->GetDesc().ShaderType), " has already been assigned. This might be a bug.");
    pDstShader = pSrcShader;
}